

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O3

int SUNLinSolSpace_SPGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  int iVar1;
  N_Vector v;
  int iVar2;
  sunindextype lrw1;
  sunindextype liw1;
  int local_30;
  int local_2c;
  
  iVar1 = *S->content;
  v = *(N_Vector *)((long)S->content + 0x88);
  if (v->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    local_2c = 0;
    local_30 = 0;
  }
  else {
    N_VSpace(v,&local_30,&local_2c);
  }
  iVar2 = iVar1 + 5;
  *lenrwLS = (long)((local_30 + iVar1) * iVar2 + 2);
  *leniwLS = (long)(iVar2 * local_2c);
  return 0;
}

Assistant:

int SUNLinSolSpace_SPGMR(SUNLinearSolver S,
                         long int *lenrwLS,
                         long int *leniwLS)
{
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPGMR_CONTENT(S)->maxl;
  if (SPGMR_CONTENT(S)->vtemp->ops->nvspace)
    N_VSpace(SPGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*(maxl + 5) + maxl*(maxl + 5) + 2;
  *leniwLS = liw1*(maxl + 5);
  return(SUNLS_SUCCESS);
}